

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cc
# Opt level: O3

string * __thiscall
iqxmlrpc::dump_request_abi_cxx11_(string *__return_storage_ptr__,iqxmlrpc *this,Request *request)

{
  Value *pVVar1;
  Value *v;
  Node name;
  XmlBuilder writer;
  Node root;
  Node param;
  Node NStack_58;
  XmlBuilder local_50;
  Node local_40;
  Node local_38;
  
  XmlBuilder::XmlBuilder(&local_50);
  XmlBuilder::Node::Node(&local_40,&local_50,"methodCall");
  XmlBuilder::Node::Node(&NStack_58,&local_50,"methodName");
  XmlBuilder::Node::set_textdata(&NStack_58,(string *)this);
  XmlBuilder::Node::~Node(&NStack_58);
  XmlBuilder::Node::Node(&NStack_58,&local_50,"params");
  v = *(Value **)(this + 0x20);
  pVVar1 = *(Value **)(this + 0x28);
  if (v != pVVar1) {
    do {
      XmlBuilder::Node::Node(&local_38,&local_50,"param");
      value_to_xml(&local_50,v);
      XmlBuilder::Node::~Node(&local_38);
      v = v + 1;
    } while (v != pVVar1);
  }
  XmlBuilder::Node::~Node(&NStack_58);
  XmlBuilder::stop(&local_50);
  XmlBuilder::content_abi_cxx11_(__return_storage_ptr__,&local_50);
  XmlBuilder::Node::~Node(&local_40);
  XmlBuilder::~XmlBuilder(&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string
dump_request(const Request& request)
{
  XmlBuilder writer;
  XmlBuilder::Node root(writer, "methodCall");

  {
    XmlBuilder::Node name(writer, "methodName");
    name.set_textdata(request.get_name());
  }

  {
    XmlBuilder::Node params(writer, "params");
    BOOST_FOREACH(const Value& v, request.get_params()) {
      XmlBuilder::Node param(writer, "param");
      value_to_xml(writer, v);
    }
  }

  writer.stop();
  return writer.content();
}